

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O3

void av1_tf_do_filtering_row(AV1_COMP *cpi,ThreadData *td,int mb_row)

{
  buf_2d *pbVar1;
  MACROBLOCKD *pMVar2;
  AV1_COMMON *pAVar3;
  buf_2d *pbVar4;
  search_site_config *psVar5;
  int64_t *piVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  uint32_t *__s;
  uint16_t *__s_00;
  uint8_t *puVar14;
  aom_variance_fn_t vf;
  YV12_BUFFER_CONFIG *pYVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined8 uVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined8 uVar24;
  TemporalFilterCtx *pTVar25;
  TemporalFilterCtx *pTVar26;
  MotionVectorSearchParams *pMVar27;
  MotionVectorSearchParams *pMVar28;
  YV12_BUFFER_CONFIG *pYVar29;
  uint8_t uVar30;
  short sVar31;
  undefined2 uVar32;
  uint uVar33;
  undefined1 *puVar34;
  uint8_t *puVar35;
  ulong uVar36;
  _func_void_yv12_buffer_config_ptr_macroblockd_ptr_BLOCK_SIZE_int_int_int_double_ptr_MV_ptr_int_ptr_int_int_int_uint8_t_ptr_uint32_t_ptr_uint16_t_ptr
  **pp_Var37;
  byte bVar38;
  byte bVar39;
  uint uVar40;
  uint uVar41;
  uint8_t *puVar42;
  int *piVar43;
  int iVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  ThreadData *pTVar48;
  AV1_COMP *pAVar49;
  MV *pMVar50;
  ulong uVar51;
  ulong uVar52;
  int16_t iVar53;
  int iVar54;
  long lVar55;
  ulong uVar56;
  int iVar57;
  uint uVar58;
  uint uVar59;
  uint8_t *puVar60;
  long lVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  uint uVar65;
  int iVar66;
  MV MVar67;
  long lVar68;
  int src_stride;
  int iVar69;
  int iVar70;
  search_site_config *psVar71;
  ulong uVar72;
  FULLPEL_MV FVar73;
  bool bVar74;
  bool bVar75;
  double dVar76;
  undefined1 auVar77 [16];
  long lVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  uint uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  MV local_42c;
  AV1_COMP *local_428;
  MV local_420;
  FRAME_TYPE local_419;
  YV12_BUFFER_CONFIG *local_418;
  uint8_t *local_410;
  uint8_t *local_408;
  MV local_3fc;
  ThreadData *local_3f8;
  search_site_config *local_3f0;
  ulong local_3e8;
  ulong local_3e0;
  uint local_3d4;
  ulong local_3d0;
  YV12_BUFFER_CONFIG *local_3c8;
  uint local_3bc;
  uint sse;
  MV baseline_mv;
  int distortion;
  FULLPEL_MV_STATS local_2f4;
  int subblock_mses [4];
  MV subblock_mvs [4];
  int mb_y;
  int mb_x;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  int cost_list [5];
  buf_2d ori_pre_buf;
  buf_2d ori_src_buf;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  
  uVar8 = (cpi->tf_ctx).num_frames;
  uVar9 = (cpi->tf_ctx).filter_frame_idx;
  iVar10 = (cpi->tf_ctx).compute_frame_diff;
  lVar68 = (long)(cpi->tf_ctx).num_pels;
  iVar11 = (cpi->tf_ctx).q_factor;
  uVar30 = ((cpi->common).seq_params)->monochrome;
  local_419 = (cpi->ppi->gf_group).frame_type[cpi->gf_frame_index];
  iVar64 = (cpi->oxcf).border_in_pixels;
  iVar62 = (mb_row * -0x20 + 8) - iVar64;
  iVar57 = mb_row * -0x20 + -0x28;
  if (iVar57 < iVar62) {
    iVar57 = iVar62;
  }
  iVar63 = (cpi->common).mi_params.mi_rows + mb_row * -8;
  iVar62 = iVar64 + iVar63 * 4 + -0x28;
  iVar64 = iVar63 * 4 + 8;
  if (iVar62 < iVar64) {
    iVar64 = iVar62;
  }
  local_3c8 = (cpi->tf_ctx).frames[(int)uVar9];
  iVar62 = (cpi->sf).hl_sf.weight_calc_level_in_tf;
  __s = (td->tf_data).accum;
  __s_00 = (td->tf_data).count;
  puVar14 = (td->tf_data).pred;
  uVar33 = (cpi->oxcf).algo_cfg.arnr_strength;
  (td->mb).mv_limits.row_min = iVar57;
  (td->mb).mv_limits.row_max = iVar64;
  if (0 < (cpi->tf_ctx).mb_cols) {
    pTVar25 = &cpi->tf_ctx;
    pTVar26 = &cpi->tf_ctx;
    pMVar2 = &(td->mb).e_mbd;
    pAVar3 = &cpi->common;
    uVar40 = (uint)(uVar30 == '\0') * 2 + 1;
    pbVar1 = &(td->mb).plane[0].src;
    pbVar4 = (td->mb).e_mbd.plane[0].pre;
    psVar5 = (td->mb).search_site_cfg_buf;
    pMVar27 = &cpi->mv_search_params;
    pMVar28 = &cpi->mv_search_params;
    puVar34 = (undefined1 *)(ulong)uVar40;
    iVar64 = 0;
    local_428 = cpi;
    local_3f8 = td;
    do {
      iVar57 = (cpi->oxcf).border_in_pixels;
      iVar63 = (cpi->common).mi_params.mi_cols;
      iVar54 = (iVar64 * -0x20 + 8) - iVar57;
      iVar44 = iVar64 * -0x20 + -0x28;
      if (iVar44 < iVar54) {
        iVar44 = iVar54;
      }
      (local_3f8->mb).mv_limits.col_min = iVar44;
      iVar63 = iVar63 + iVar64 * -8;
      iVar44 = iVar57 + iVar63 * 4 + -0x28;
      iVar57 = iVar63 * 4 + 8;
      if (iVar44 < iVar57) {
        iVar57 = iVar44;
      }
      (local_3f8->mb).mv_limits.col_max = iVar57;
      memset(__s,0,lVar68 * 4);
      memset(__s_00,0,lVar68 * 2);
      if ((cpi->sf).hl_sf.allow_sub_blk_me_in_tf == 0) {
        bVar16 = true;
      }
      else {
        uVar58 = local_3c8->flags;
        iVar57 = (local_3c8->field_4).field_0.y_stride;
        vf = cpi->ppi->fn_ptr[0].vf;
        puVar60 = (local_3c8->field_5).buffers[0] + (iVar57 * mb_row + iVar64) * 0x20;
        local_418 = (YV12_BUFFER_CONFIG *)((long)iVar57 << 2);
        puVar35 = (uint8_t *)0x0;
        iVar63 = 0x7fffffff;
        iVar44 = 0;
        do {
          uVar47 = 0xfffffffffffffffc;
          local_410 = puVar35;
          local_408 = puVar60;
          do {
            iVar54 = av1_calc_normalized_variance(vf,local_408 + uVar47 + 4,iVar57,uVar58 >> 3 & 1);
            if (iVar54 <= iVar63) {
              iVar63 = iVar54;
            }
            if (iVar54 < iVar44) {
              iVar54 = iVar44;
            }
            iVar44 = iVar54;
            uVar47 = uVar47 + 4;
          } while (uVar47 < 0x1c);
          puVar35 = local_410 + 4;
          puVar60 = local_408 + (long)&local_418->field_0;
        } while (local_410 < (uint8_t *)0x1c);
        local_408 = (uint8_t *)log1p((double)iVar63 * 0.0625);
        dVar76 = log1p((double)iVar44 * 0.0625);
        bVar16 = 4.0 < dVar76 - (double)local_408;
        cpi = local_428;
      }
      pAVar49 = cpi;
      if (0 < (int)uVar8) {
        uVar47 = 0;
        local_420.row = 0;
        local_420.col = 0;
        local_3fc.row = 0;
        local_3fc.col = 0;
        do {
          pYVar15 = local_3c8;
          local_418 = (pAVar49->tf_ctx).frames[uVar47];
          if (local_418 != (YV12_BUFFER_CONFIG *)0x0) {
            subblock_mvs = (MV  [4])ZEXT816(0);
            subblock_mses[0] = _DAT_004d66c0;
            subblock_mses[1] = _UNK_004d66c4;
            subblock_mses[2] = _UNK_004d66c8;
            subblock_mses[3] = _UNK_004d66cc;
            if (uVar47 == uVar9) {
              bVar74 = false;
              uVar58 = uVar33;
              local_420 = (MV)-(int)local_420;
              local_3fc = (MV)-(int)local_3fc;
            }
            else {
              iVar57 = (local_428->common).width;
              iVar63 = (local_428->common).height;
              if (iVar57 < iVar63) {
                iVar63 = iVar57;
              }
              iVar57 = (local_3c8->field_4).field_0.y_stride;
              local_410 = (uint8_t *)CONCAT44(local_410._4_4_,(local_3c8->field_0).field_0.y_width);
              local_3f0 = (search_site_config *)
                          CONCAT44(local_3f0._4_4_,(local_418->field_0).field_0.y_width);
              puVar35 = pbVar1->buf;
              puVar60 = (td->mb).plane[0].src.buf0;
              uVar17 = (td->mb).plane[0].src.width;
              uVar18 = (td->mb).plane[0].src.height;
              uVar19 = *(undefined8 *)&(td->mb).plane[0].src.stride;
              puVar20 = pbVar4->buf;
              puVar21 = (td->mb).e_mbd.plane[0].pre[0].buf0;
              uVar22 = (td->mb).e_mbd.plane[0].pre[0].width;
              uVar23 = (td->mb).e_mbd.plane[0].pre[0].height;
              uVar24 = *(undefined8 *)&(td->mb).e_mbd.plane[0].pre[0].stride;
              iVar44 = (local_3c8->field_2).field_0.y_crop_width;
              iVar54 = (local_3c8->field_3).field_0.y_crop_height;
              if (iVar54 < iVar44) {
                iVar54 = iVar44;
              }
              local_3d4 = uVar33;
              iVar44 = av1_init_search_range(iVar54);
              local_3e0 = CONCAT44(local_3e0._4_4_,iVar44);
              uVar33 = (uint)(byte)((0x1df < iVar63) + 1);
              if (0x2cf < iVar63) {
                uVar33 = 3;
              }
              local_3e8 = CONCAT44(local_3e8._4_4_,uVar33);
              local_408 = (uint8_t *)
                          CONCAT71(local_408._1_7_,
                                   (local_428->common).features.cur_frame_force_integer_mv);
              iVar53 = local_420.row;
              bVar74 = -1 < iVar53;
              bVar75 = -1 < local_3fc.row;
              baseline_mv.row = 0;
              baseline_mv.col = 0;
              puVar42 = (uint8_t *)(long)((iVar57 * mb_row + iVar64) * 0x20);
              (local_3f8->mb).plane[0].src.buf = (pYVar15->field_5).buffers[0] + (long)puVar42;
              (local_3f8->mb).plane[0].src.stride = iVar57;
              (local_3f8->mb).plane[0].src.width = (int)local_410;
              (local_3f8->mb).e_mbd.plane[0].pre[0].buf =
                   (local_418->field_5).buffers[0] + (long)puVar42;
              (local_3f8->mb).e_mbd.plane[0].pre[0].stride = iVar57;
              (local_3f8->mb).e_mbd.plane[0].pre[0].width = (uint)local_3f0;
              (local_3f8->mb).e_mbd.mi_row = mb_row * 8;
              (local_3f8->mb).e_mbd.mi_col = iVar64 * 8;
              psVar71 = pMVar28->search_site_cfg[0];
              local_410 = puVar42;
              if (((iVar57 != (local_428->mv_search_params).search_site_cfg[0][0].stride) &&
                  (psVar71 = pMVar27->search_site_cfg[1],
                  iVar57 != (local_428->mv_search_params).search_site_cfg[1][0].stride)) &&
                 (psVar71 = psVar5, iVar57 != (local_3f8->mb).search_site_cfg_buf[1].stride)) {
                init_motion_compensation_nstep((td->mb).search_site_cfg_buf + 1,iVar57,0);
                iVar53 = local_420.row;
              }
              pTVar48 = local_3f8;
              FVar73 = (FULLPEL_MV)
                       ((int)iVar53 + (uint)bVar74 + 3 >> 3 & 0xffff |
                       ((uint)bVar75 + (int)local_3fc.row) * 0x2000 + 0x6000 & 0xffff0000);
              dVar76 = av1_convert_qindex_to_q
                                 ((local_428->ppi->p_rc).avg_frame_qindex
                                  [(local_428->ppi->gf_group).frame_type[local_428->gf_frame_index]]
                                  ,((local_428->common).seq_params)->bit_depth);
              av1_make_default_fullpel_ms_params
                        (&full_ms_params,local_428,&pTVar48->mb,BLOCK_32X32,&baseline_mv,FVar73,
                         psVar71,'\x01',0);
              full_ms_params.run_mesh_search = 1;
              full_ms_params.mv_cost_params.mv_cost_type = (MV_COST_TYPE)local_3e8;
              if ((local_428->sf).mv_sf.prune_mesh_search == PRUNE_MESH_SEARCH_LVL_1) {
                full_ms_params.prune_mesh_search._0_1_ = 0x14 < (int)dVar76;
                full_ms_params.run_mesh_search = 1;
                full_ms_params.prune_mesh_search._1_3_ = 0;
                full_ms_params.mesh_search_mv_diff_threshold = 2;
              }
              local_3d0 = CONCAT44(local_3d0._4_4_,(int)dVar76);
              if ((local_428->sf).mv_sf.subpel_search_method == '\0') {
                piVar43 = (int *)0x0;
              }
              else {
                piVar43 = cost_list;
                if ((local_428->sf).mv_sf.use_fullpel_costlist == 0) {
                  piVar43 = (int *)0x0;
                }
              }
              local_3f0 = psVar71;
              av1_full_pixel_search
                        (FVar73,&full_ms_params,(int)local_3e0,piVar43,(FULLPEL_MV *)&local_42c,
                         &local_2f4,(FULLPEL_MV *)0x0);
              pAVar49 = local_428;
              if ((char)local_408 == '\0') {
                av1_make_default_subpel_ms_params
                          (&ms_params,local_428,&local_3f8->mb,BLOCK_32X32,&baseline_mv,cost_list);
                ms_params.forced_stop = '\0';
                ms_params.var_params.subpel_search_type = '\x03';
                ms_params.mv_cost_params.mv_cost_type = '\x04';
                local_2f4.err_cost = 0;
                uVar33 = (*(pAVar49->mv_search_params).find_fractional_mv_step)
                                   (pMVar2,pAVar3,&ms_params,
                                    (MV)(((uint)local_42c >> 0x10) * 0x80000 +
                                        ((uint)local_42c & 0x1fff) * 8),&local_2f4,&local_42c,
                                    &distortion,&sse,(int_mv *)0x0);
                local_3fc = (MV)((uint)local_42c >> 0x10);
                bVar74 = uVar33 * 0x32 < sse;
                local_420 = local_42c;
                if (bVar16) {
                  FVar73 = (FULLPEL_MV)
                           ((int)local_42c.row + (uint)(-1 < local_42c.row) + 3 >> 3 & 0xffff |
                           (((int)local_42c >> 0x10) - ((int)~(uint)local_42c >> 0x1f)) * 0x2000 +
                           0x6000U & 0xffff0000);
                  bVar75 = 0x14 < (int)(uint)local_3d0;
                  local_3d0 = CONCAT44(local_3d0._4_4_,0x100);
                  uVar46 = 0;
                  puVar42 = (uint8_t *)0x0;
                  do {
                    pAVar49 = local_428;
                    puVar42 = (uint8_t *)(long)(int)puVar42;
                    uVar72 = 0;
                    pTVar48 = local_3f8;
                    do {
                      (pTVar48->mb).plane[0].src.buf =
                           (local_3c8->field_5).buffers[0] + (long)local_410 + uVar72;
                      (pTVar48->mb).e_mbd.plane[0].pre[0].buf =
                           (local_418->field_5).buffers[0] + (long)local_410 + uVar72;
                      local_408 = puVar42;
                      av1_make_default_fullpel_ms_params
                                (&full_ms_params,pAVar49,&pTVar48->mb,BLOCK_16X16,&baseline_mv,
                                 FVar73,local_3f0,'\x01',0);
                      full_ms_params.run_mesh_search = 1;
                      full_ms_params.mv_cost_params.mv_cost_type = (MV_COST_TYPE)local_3e8;
                      if ((pAVar49->sf).mv_sf.prune_mesh_search == PRUNE_MESH_SEARCH_LVL_1) {
                        full_ms_params.prune_mesh_search._0_1_ = bVar75;
                        full_ms_params.run_mesh_search = 1;
                        full_ms_params.prune_mesh_search._1_3_ = 0;
                        full_ms_params.mesh_search_mv_diff_threshold = 2;
                      }
                      if ((pAVar49->sf).mv_sf.subpel_search_method == '\0') {
                        piVar43 = (int *)0x0;
                      }
                      else {
                        piVar43 = cost_list;
                        if ((pAVar49->sf).mv_sf.use_fullpel_costlist == 0) {
                          piVar43 = (int *)0x0;
                        }
                      }
                      av1_full_pixel_search
                                (FVar73,&full_ms_params,(int)local_3e0,piVar43,
                                 (FULLPEL_MV *)&local_42c,&local_2f4,(FULLPEL_MV *)0x0);
                      pTVar48 = local_3f8;
                      av1_make_default_subpel_ms_params
                                (&ms_params,pAVar49,&local_3f8->mb,BLOCK_16X16,&baseline_mv,
                                 cost_list);
                      ms_params.forced_stop = '\0';
                      ms_params.var_params.subpel_search_type = '\x03';
                      ms_params.mv_cost_params.mv_cost_type = '\x04';
                      local_2f4.err_cost = 0;
                      iVar44 = (*(pAVar49->mv_search_params).find_fractional_mv_step)
                                         (pMVar2,pAVar3,&ms_params,
                                          (MV)(((uint)local_42c >> 0x10) * 0x80000 +
                                              ((uint)local_42c & 0x1fff) * 8),&local_2f4,&local_42c,
                                          &distortion,&sse,(int_mv *)0x0);
                      subblock_mses[(long)local_408] = (iVar44 + 0x80U) / (uint)local_3d0;
                      subblock_mvs[(long)local_408] = local_42c;
                      puVar42 = local_408 + 1;
                      uVar72 = uVar72 + 0x10;
                    } while (uVar72 < 0x20);
                    uVar46 = uVar46 + 0x10;
                    local_410 = local_410 + (long)iVar57 * 0x10;
                    MVar67 = local_420;
                  } while (uVar46 < 0x20);
                  goto LAB_00239238;
                }
                uVar33 = uVar33 + 0x200 >> 10;
                (td->mb).plane[0].src.width = uVar17;
                (td->mb).plane[0].src.height = uVar18;
                *(undefined8 *)&(td->mb).plane[0].src.stride = uVar19;
                pbVar1->buf = puVar35;
                (td->mb).plane[0].src.buf0 = puVar60;
                (td->mb).e_mbd.plane[0].pre[0].width = uVar22;
                (td->mb).e_mbd.plane[0].pre[0].height = uVar23;
                *(undefined8 *)&(td->mb).e_mbd.plane[0].pre[0].stride = uVar24;
                pbVar4->buf = puVar20;
                (td->mb).e_mbd.plane[0].pre[0].buf0 = puVar21;
                MVar67 = local_42c;
LAB_002393d7:
                subblock_mvs[0] = MVar67;
                subblock_mvs[1] = MVar67;
                subblock_mvs[2] = MVar67;
                subblock_mvs[3] = MVar67;
                subblock_mses[0] = uVar33;
                subblock_mses[1] = uVar33;
                subblock_mses[2] = uVar33;
                subblock_mses[3] = uVar33;
              }
              else {
                sVar31 = local_42c.row;
                iVar44 = (int)local_42c >> 0x10;
                auVar77 = psllw(ZEXT416((uint)local_42c),3);
                local_42c = auVar77._0_4_;
                uVar33 = (*local_428->ppi->fn_ptr[9].vf)
                                   ((local_418->field_5).buffers[0] + (long)local_410 +
                                    (sVar31 * iVar57 + iVar44),iVar57,
                                    (local_3c8->field_5).buffers[0] + (long)local_410,iVar57,&sse);
                bVar74 = false;
                MVar67 = local_42c;
LAB_00239238:
                uVar33 = uVar33 + 0x200 >> 10;
                (td->mb).plane[0].src.width = uVar17;
                (td->mb).plane[0].src.height = uVar18;
                *(undefined8 *)&(td->mb).plane[0].src.stride = uVar19;
                pbVar1->buf = puVar35;
                (td->mb).plane[0].src.buf0 = puVar60;
                (td->mb).e_mbd.plane[0].pre[0].width = uVar22;
                (td->mb).e_mbd.plane[0].pre[0].height = uVar23;
                *(undefined8 *)&(td->mb).e_mbd.plane[0].pre[0].stride = uVar24;
                pbVar4->buf = puVar20;
                (td->mb).e_mbd.plane[0].pre[0].buf0 = puVar21;
                if (!bVar16) goto LAB_002393d7;
                lVar61 = 0;
                lVar78 = 0;
                lVar55 = 0;
                auVar77 = _DAT_0050be30;
                auVar80 = _DAT_0050f6e0;
                do {
                  uVar46 = *(ulong *)(subblock_mses + lVar55);
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = uVar46;
                  iVar57 = (int)uVar46;
                  iVar44 = (int)(uVar46 >> 0x20);
                  auVar84._0_4_ = -(uint)(auVar77._0_4_ < iVar57);
                  auVar84._4_4_ = -(uint)(auVar77._4_4_ < iVar44);
                  auVar84._8_4_ = -(uint)(auVar77._8_4_ < 0);
                  auVar84._12_4_ = -(uint)(auVar77._12_4_ < 0);
                  auVar79._0_4_ = -(uint)(iVar57 < auVar80._0_4_);
                  auVar79._4_4_ = -(uint)(iVar44 < auVar80._4_4_);
                  auVar79._8_4_ = -(uint)(0 < auVar80._8_4_);
                  auVar79._12_4_ = -(uint)(0 < auVar80._12_4_);
                  auVar83._8_4_ = iVar44;
                  auVar83._0_8_ = uVar46;
                  auVar83._12_4_ = -(uint)((long)uVar46 < 0);
                  lVar61 = lVar61 + CONCAT44(-(uint)(iVar57 < 0),iVar57);
                  lVar78 = lVar78 + auVar83._8_8_;
                  auVar77 = ~auVar84 & auVar82 | auVar77 & auVar84;
                  auVar80 = ~auVar79 & auVar82 | auVar80 & auVar79;
                  lVar55 = lVar55 + 2;
                } while (lVar55 != 4);
                uVar81 = -(uint)((int)auVar80._4_4_ < (int)auVar80._0_4_);
                uVar58 = -(uint)((int)auVar77._0_4_ < (int)auVar77._4_4_);
                iVar57 = (~uVar81 & auVar80._4_4_ | auVar80._0_4_ & uVar81) -
                         (~uVar58 & auVar77._4_4_ | auVar77._0_4_ & uVar58);
                lVar55 = (lVar78 + lVar61) * 4;
                if ((((long)(ulong)(uVar33 * 0xf) < lVar55) && (iVar57 < 0x30)) ||
                   (((long)(ulong)(uVar33 * 0xe) < lVar55 && (iVar57 < 0x18)))) goto LAB_002393d7;
              }
              MVar67.row = 0;
              MVar67.col = 0;
              pAVar49 = local_428;
              uVar58 = local_3d4;
              if ((int)((uint)(0x2cf < iVar63) * 9 + 3 <<
                       ((char)(local_3f8->mb).e_mbd.bd - 8U & 0x1f)) < (int)uVar33) {
                local_420 = MVar67;
                local_3fc = MVar67;
              }
            }
            uVar33 = 1;
            if ((int)uVar58 < 1) {
              uVar33 = uVar58;
            }
            if (!bVar74) {
              uVar33 = uVar58;
            }
            if (local_419 != '\0') {
              uVar33 = uVar58;
            }
            if ((pAVar49->oxcf).kf_cfg.enable_keyframe_filtering != 1) {
              uVar33 = uVar58;
            }
            pYVar15 = (pAVar49->tf_ctx).frames[uVar47];
            if (uVar47 == uVar9) {
              uVar58 = ((local_3f8->mb).e_mbd.cur_buf)->flags;
              local_3f0 = (search_site_config *)((ulong)local_3f0 & 0xffffffff00000000);
              pYVar29 = (YV12_BUFFER_CONFIG *)0x0;
              do {
                local_418 = pYVar29;
                uVar81 = (td->mb).e_mbd.plane[(long)local_418].subsampling_y;
                uVar65 = 0x20 >> ((byte)uVar81 & 0x1f);
                local_3e0 = CONCAT44(local_3e0._4_4_,uVar65);
                uVar41 = (td->mb).e_mbd.plane[(long)local_418].subsampling_x;
                local_3e8 = 0x20L >> ((byte)uVar41 & 0x3f);
                iVar57 = (int)local_3e8;
                if (uVar81 < 6) {
                  puVar35 = pYVar15->store_buf_adr[(long)((long)&local_418[-1].metadata + 4)];
                  iVar63 = *(int *)((long)pYVar15->store_buf_adr +
                                   (ulong)(local_418 != (YV12_BUFFER_CONFIG *)0x0) * 4 + -0x28);
                  local_408 = (uint8_t *)((ulong)local_3f0 & 0xffffffff);
                  lVar55 = (long)(int)(iVar64 * iVar57 + uVar65 * mb_row * iVar63);
                  local_410 = puVar35 + lVar55;
                  iVar44 = 0;
                  iVar54 = 0;
                  iVar70 = 0;
                  do {
                    if (uVar41 < 6) {
                      lVar61 = 0;
                      do {
                        if ((uVar58 & 8) == 0) {
                          uVar81 = (uint)local_410[lVar61 + iVar54];
                        }
                        else {
                          uVar81 = (uint)*(ushort *)
                                          (lVar55 * 2 + (long)puVar35 * 2 + (long)iVar54 * 2 +
                                          lVar61 * 2);
                        }
                        __s[(long)(local_408 + iVar70 + lVar61)] =
                             __s[(long)(local_408 + iVar70 + lVar61)] + uVar81 * 1000;
                        __s_00[(long)(local_408 + iVar70 + lVar61)] =
                             __s_00[(long)(local_408 + iVar70 + lVar61)] + 1000;
                        lVar61 = lVar61 + 1;
                        iVar69 = (int)lVar61;
                      } while (iVar57 + (uint)(local_3e8 == 0) != iVar69);
                      iVar70 = iVar70 + iVar69;
                      iVar54 = iVar54 + iVar69;
                    }
                    iVar54 = iVar54 + (iVar63 - iVar57);
                    iVar44 = iVar44 + 1;
                  } while (iVar44 != uVar65 + (uVar65 == 0));
                }
                local_3f0 = (search_site_config *)
                            CONCAT44(local_3f0._4_4_,(uint)local_3f0 + uVar65 * iVar57);
                pYVar29 = (YV12_BUFFER_CONFIG *)((long)&local_418->field_0 + 1);
                pAVar49 = local_428;
              } while (pYVar29 != (YV12_BUFFER_CONFIG *)puVar34);
            }
            else {
              iVar57 = (local_3f8->mb).e_mbd.bd;
              uVar58 = (uint)pYVar15->flags >> 3 & 1;
              iVar63 = iVar57 + -7;
              if (iVar57 < 0xb) {
                iVar63 = 3;
              }
              iVar44 = 0x15 - iVar57;
              if (iVar57 < 0xb) {
                iVar44 = 0xb;
              }
              lVar55 = 0;
              local_3bc = 0;
              local_3d4 = uVar58;
              do {
                FVar73 = (FULLPEL_MV)(td->mb).e_mbd.plane[lVar55].subsampling_x;
                uVar81 = (td->mb).e_mbd.plane[lVar55].subsampling_y;
                bVar38 = (byte)uVar81;
                uVar36 = 0x20L >> (bVar38 & 0x3f);
                bVar39 = (byte)FVar73.row;
                uVar56 = 0x20L >> (bVar39 & 0x3f);
                uVar72 = 0x10L >> (bVar38 & 0x3f);
                uVar46 = 0x10L >> (bVar39 & 0x3f);
                if (uVar81 < 6) {
                  puVar35 = pYVar15->store_buf_adr[lVar55 + -4];
                  uVar51 = (ulong)(lVar55 != 0);
                  iVar54 = *(int *)((long)pYVar15->store_buf_adr + uVar51 * 4 + -0x48);
                  uVar12 = *(undefined4 *)((long)pYVar15->store_buf_adr + uVar51 * 4 + -0x40);
                  uVar13 = *(undefined4 *)((long)pYVar15->store_buf_adr + uVar51 * 4 + -0x28);
                  puVar60 = puVar14 + local_3bc;
                  lVar61 = uVar72 * uVar56;
                  uVar51 = 0;
                  local_3f0 = (search_site_config *)CONCAT44(local_3f0._4_4_,uVar81);
                  local_418 = (YV12_BUFFER_CONFIG *)
                              CONCAT44(local_418._4_4_,(0x120U >> (bVar39 & 0x1f)) * -0x400 + 0x1000
                                      );
                  local_3e8 = uVar46;
                  local_3d0 = uVar72;
                  iVar70 = 0;
                  do {
                    local_410 = (uint8_t *)CONCAT44(local_410._4_4_,iVar70);
                    local_408 = puVar60;
                    if ((uint)FVar73 < 6) {
                      local_3e0 = CONCAT44(local_3e0._4_4_,
                                           (mb_row * 0x20 >> (bVar38 & 0x1f)) + (int)uVar51);
                      pMVar50 = subblock_mvs + iVar70;
                      uVar52 = 0;
                      do {
                        ms_params.allow_hp = *(int *)pMVar50;
                        full_ms_params.mesh_search_mv_diff_threshold = (int)uVar46;
                        full_ms_params.force_mesh_thresh = (int)uVar72;
                        full_ms_params.mesh_patterns[0]._0_4_ = (int)local_3e0;
                        full_ms_params.mesh_patterns[0]._4_4_ =
                             ((uint)(iVar64 * 0x20) >> (bVar39 & 0x1f)) + (int)uVar52;
                        full_ms_params.sdf._4_4_ = 0;
                        full_ms_params.bsize = BLOCK_4X4;
                        full_ms_params._1_7_ = 0;
                        full_ms_params.mv_limits.row_min = 0x5dade0;
                        full_ms_params.mv_limits.row_max = 0;
                        full_ms_params.run_mesh_search = 0x5dade0;
                        full_ms_params.prune_mesh_search = 0;
                        full_ms_params.mesh_patterns[1] = (MESH_PATTERN *)0x0;
                        full_ms_params.ms_buffers.mask_stride = 0;
                        full_ms_params.ms_buffers.wsrc = (int32_t *)0x0;
                        full_ms_params.ms_buffers.obmc_mask._0_4_ = 0;
                        full_ms_params._76_4_ = SUB84(lVar55,0);
                        full_ms_params.search_sites = (search_site_config *)0x0;
                        full_ms_params.ms_buffers.obmc_mask._4_4_ = iVar63;
                        full_ms_params._72_4_ = iVar44;
                        full_ms_params._136_8_ = puVar35;
                        full_ms_params.fast_obmc_search = iVar54;
                        full_ms_params._148_4_ = uVar12;
                        full_ms_params.mv_cost_params.ref_mv._0_4_ = uVar13;
                        full_ms_params.mv_cost_params.full_ref_mv = FVar73;
                        full_ms_params.mv_cost_params._12_4_ = uVar81;
                        full_ms_params.mv_cost_params.mvjcost = &(pTVar25->sf).x_scale_fp;
                        full_ms_params.mv_cost_params.mvcost[0]._0_4_ = iVar57;
                        full_ms_params.mv_cost_params.mvcost[0]._4_4_ = uVar58;
                        full_ms_params.sdx4df._0_4_ = (0x120U >> (bVar38 & 0x1f)) * -0x400 + 0x1000;
                        full_ms_params.sdx4df._4_4_ = local_418._0_4_;
                        av1_enc_build_one_inter_predictor
                                  (local_408 + uVar52,(int)uVar56,(MV *)&ms_params,
                                   (InterPredParams *)&full_ms_params);
                        uVar52 = uVar52 + local_3e8;
                        pMVar50 = pMVar50 + 1;
                        local_410 = (uint8_t *)CONCAT44(local_410._4_4_,(int)local_410 + 1);
                        uVar46 = local_3e8;
                        uVar72 = local_3d0;
                        uVar58 = local_3d4;
                        uVar81 = (uint)local_3f0;
                      } while (uVar52 < uVar56);
                    }
                    uVar51 = uVar51 + uVar72;
                    puVar60 = local_408 + lVar61;
                    iVar70 = (int)local_410;
                  } while (uVar51 < uVar36);
                }
                local_3bc = (int)uVar36 * (int)uVar56 + local_3bc;
                lVar55 = lVar55 + 1;
              } while ((undefined1 *)lVar55 != puVar34);
              pp_Var37 = &av1_highbd_apply_temporal_filter;
              if ((local_3c8->flags & 8) == 0) {
                pp_Var37 = &av1_apply_temporal_filter;
              }
              (**pp_Var37)(local_3c8,pMVar2,BLOCK_32X32,mb_row,iVar64,uVar40,pTVar26->noise_levels,
                           subblock_mvs,subblock_mses,iVar11,uVar33,iVar62,puVar14,__s,__s_00);
              pAVar49 = local_428;
            }
          }
          uVar47 = uVar47 + 1;
        } while (uVar47 != uVar8);
      }
      cpi = local_428;
      pYVar15 = (pAVar49->tf_ctx).output_frame;
      uVar81 = pYVar15->flags;
      uVar58 = 0;
      psVar71 = (search_site_config *)0x0;
      do {
        local_3f0 = psVar71;
        uVar41 = (td->mb).e_mbd.plane[(long)local_3f0].subsampling_y;
        uVar59 = 0x20 >> ((byte)uVar41 & 0x1f);
        uVar65 = (td->mb).e_mbd.plane[(long)local_3f0].subsampling_x;
        local_3d0 = 0x20L >> ((byte)uVar65 & 0x3f);
        iVar57 = (int)local_3d0;
        if (uVar41 < 6) {
          local_408 = pYVar15->store_buf_adr[(long)&local_3f0[-1].stride];
          local_410 = (uint8_t *)((long)local_408 * 2);
          iVar63 = *(int *)((long)pYVar15->store_buf_adr +
                           (ulong)(local_3f0 != (search_site_config *)0x0) * 4 + -0x28);
          iVar69 = iVar57 * iVar64 + uVar59 * mb_row * iVar63;
          iVar63 = iVar63 - iVar57;
          local_3e0 = (ulong)uVar58;
          iVar70 = uVar59 + (uVar59 == 0);
          iVar54 = 0;
          iVar44 = 0;
          local_418 = (YV12_BUFFER_CONFIG *)CONCAT44(local_418._4_4_,iVar63);
          local_3e8 = CONCAT44(local_3e8._4_4_,iVar70);
          do {
            if (uVar65 < 6) {
              lVar55 = (long)iVar44 + local_3e0;
              lVar61 = 0;
              do {
                uVar7 = __s_00[lVar55 + lVar61];
                uVar47 = (ulong)uVar7;
                uVar45 = (uint)(uVar7 >> 1);
                uVar41 = (uint)uVar7;
                if ((uVar81 & 8) == 0) {
                  if (uVar41 < 0x400) {
                    iVar66 = 0x1f;
                    if (uVar41 != 0) {
                      for (; uVar7 >> iVar66 == 0; iVar66 = iVar66 + -1) {
                      }
                    }
                    uVar30 = (uint8_t)((uint)((ulong)*(uint *)(&DAT_005e473c + uVar47 * 8) +
                                              (ulong)(uVar45 + __s[lVar55 + lVar61]) *
                                              (ulong)*(uint *)(&DAT_005e4738 + uVar47 * 8) >> 0x20)
                                      >> ((byte)iVar66 & 0x1f));
                  }
                  else {
                    uVar30 = (uint8_t)((uVar45 + __s[lVar55 + lVar61]) / uVar41);
                  }
                  local_408[lVar61 + iVar69] = uVar30;
                }
                else {
                  if (uVar7 < 0x400) {
                    iVar66 = 0x1f;
                    if (uVar7 != 0) {
                      for (; uVar7 >> iVar66 == 0; iVar66 = iVar66 + -1) {
                      }
                    }
                    uVar32 = (undefined2)
                             ((uint)((ulong)*(uint *)(&DAT_005e473c + uVar47 * 8) +
                                     (ulong)(uVar45 + __s[lVar55 + lVar61]) *
                                     (ulong)*(uint *)(&DAT_005e4738 + uVar47 * 8) >> 0x20) >>
                             ((byte)iVar66 & 0x1f));
                  }
                  else {
                    uVar32 = (undefined2)((uVar45 + __s[lVar55 + lVar61]) / (uint)uVar7);
                  }
                  *(undefined2 *)(local_410 + lVar61 * 2 + (long)iVar69 * 2) = uVar32;
                }
                lVar61 = lVar61 + 1;
                iVar66 = (int)lVar61;
              } while (iVar57 + (uint)(local_3d0 == 0) != iVar66);
              iVar44 = iVar44 + iVar66;
              iVar69 = iVar69 + iVar66;
            }
            iVar69 = iVar69 + iVar63;
            iVar54 = iVar54 + 1;
          } while (iVar54 != iVar70);
        }
        uVar58 = uVar58 + uVar59 * iVar57;
        psVar71 = (search_site_config *)((long)&local_3f0->site[0][0].mv.row + 1);
      } while (psVar71 != (search_site_config *)puVar34);
      if (iVar10 != 0) {
        iVar57 = (local_3c8->field_4).field_0.y_stride;
        pYVar15 = (local_428->tf_ctx).output_frame;
        iVar63 = (pYVar15->field_4).field_0.y_stride;
        iVar44 = (0x20U >> ((byte)(local_3f8->mb).e_mbd.plane[0].subsampling_y & 0x1f)) * mb_row;
        iVar54 = (0x20U >> ((byte)(local_3f8->mb).e_mbd.plane[0].subsampling_x & 0x1f)) * iVar64;
        full_ms_params._0_8_ = full_ms_params._0_8_ & 0xffffffff00000000;
        (*local_428->ppi->fn_ptr[9].vf)
                  ((local_3c8->field_5).buffers[0] + (iVar44 * iVar57 + iVar54),iVar57,
                   (pYVar15->field_5).field_0.y_buffer + (iVar54 + iVar63 * iVar44),iVar63,
                   (uint *)&full_ms_params);
        uVar47 = full_ms_params._0_8_ & 0xffffffff;
        (local_3f8->tf_data).diff.sum = (local_3f8->tf_data).diff.sum + uVar47;
        piVar6 = &(local_3f8->tf_data).diff.sse;
        *piVar6 = *piVar6 + uVar47 * uVar47;
      }
      iVar64 = iVar64 + 1;
    } while (iVar64 < (cpi->tf_ctx).mb_cols);
  }
  return;
}

Assistant:

void av1_tf_do_filtering_row(AV1_COMP *cpi, ThreadData *td, int mb_row) {
  TemporalFilterCtx *tf_ctx = &cpi->tf_ctx;
  YV12_BUFFER_CONFIG **frames = tf_ctx->frames;
  const int num_frames = tf_ctx->num_frames;
  const int filter_frame_idx = tf_ctx->filter_frame_idx;
  const int compute_frame_diff = tf_ctx->compute_frame_diff;
  const struct scale_factors *scale = &tf_ctx->sf;
  const double *noise_levels = tf_ctx->noise_levels;
  const int num_pels = tf_ctx->num_pels;
  const int q_factor = tf_ctx->q_factor;
  const BLOCK_SIZE block_size = TF_BLOCK_SIZE;
  const YV12_BUFFER_CONFIG *const frame_to_filter = frames[filter_frame_idx];
  MACROBLOCK *const mb = &td->mb;
  MACROBLOCKD *const mbd = &mb->e_mbd;
  TemporalFilterData *const tf_data = &td->tf_data;
  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int mi_h = mi_size_high_log2[block_size];
  const int mi_w = mi_size_wide_log2[block_size];
  const int num_planes = av1_num_planes(&cpi->common);
  const int weight_calc_level_in_tf = cpi->sf.hl_sf.weight_calc_level_in_tf;
  uint32_t *accum = tf_data->accum;
  uint16_t *count = tf_data->count;
  uint8_t *pred = tf_data->pred;

  // Factor to control the filering strength.
  int filter_strength = cpi->oxcf.algo_cfg.arnr_strength;
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  const FRAME_TYPE frame_type = gf_group->frame_type[cpi->gf_frame_index];

  // Do filtering.
  FRAME_DIFF *diff = &td->tf_data.diff;
  av1_set_mv_row_limits(&cpi->common.mi_params, &mb->mv_limits,
                        (mb_row << mi_h), (mb_height >> MI_SIZE_LOG2),
                        cpi->oxcf.border_in_pixels);
  for (int mb_col = 0; mb_col < tf_ctx->mb_cols; mb_col++) {
    av1_set_mv_col_limits(&cpi->common.mi_params, &mb->mv_limits,
                          (mb_col << mi_w), (mb_width >> MI_SIZE_LOG2),
                          cpi->oxcf.border_in_pixels);
    memset(accum, 0, num_pels * sizeof(accum[0]));
    memset(count, 0, num_pels * sizeof(count[0]));
    MV ref_mv = kZeroMv;  // Reference motion vector passed down along frames.
                          // Perform temporal filtering frame by frame.

    // Decide whether to perform motion search at 16x16 sub-block level or not
    // based on 4x4 sub-blocks source variance. Allow motion search for split
    // partition only if the difference between max and min source variance of
    // 4x4 blocks is greater than a threshold (which is derived empirically).
    bool allow_me_for_sub_blks = true;
    if (cpi->sf.hl_sf.allow_sub_blk_me_in_tf) {
      const int is_hbd = is_frame_high_bitdepth(frame_to_filter);
      // Initialize minimum variance to a large value and maximum variance to 0.
      double blk_4x4_var_min = DBL_MAX;
      double blk_4x4_var_max = 0;
      get_log_var_4x4sub_blk(cpi, frame_to_filter, mb_row, mb_col,
                             TF_BLOCK_SIZE, &blk_4x4_var_min, &blk_4x4_var_max,
                             is_hbd);
      // TODO(sanampudi.venkatarao@ittiam.com): Experiment and adjust the
      // threshold for high bit depth.
      if ((blk_4x4_var_max - blk_4x4_var_min) <= 4.0)
        allow_me_for_sub_blks = false;
    }

    for (int frame = 0; frame < num_frames; frame++) {
      if (frames[frame] == NULL) continue;

      // Motion search.
      MV subblock_mvs[4] = { kZeroMv, kZeroMv, kZeroMv, kZeroMv };
      int subblock_mses[4] = { INT_MAX, INT_MAX, INT_MAX, INT_MAX };
      int is_dc_diff_large = 0;

      if (frame ==
          filter_frame_idx) {  // Frame to be filtered.
                               // Change ref_mv sign for following frames.
        ref_mv.row *= -1;
        ref_mv.col *= -1;
      } else {  // Other reference frames.
        tf_motion_search(cpi, mb, frame_to_filter, frames[frame], block_size,
                         mb_row, mb_col, &ref_mv, allow_me_for_sub_blks,
                         subblock_mvs, subblock_mses, &is_dc_diff_large);
      }

      if (cpi->oxcf.kf_cfg.enable_keyframe_filtering == 1 &&
          frame_type == KEY_FRAME && is_dc_diff_large)
        filter_strength = AOMMIN(filter_strength, 1);

      // Perform weighted averaging.
      if (frame == filter_frame_idx) {  // Frame to be filtered.
        tf_apply_temporal_filter_self(frames[frame], mbd, block_size, mb_row,
                                      mb_col, num_planes, accum, count);
      } else {  // Other reference frames.
        tf_build_predictor(frames[frame], mbd, block_size, mb_row, mb_col,
                           num_planes, scale, subblock_mvs, pred);

        // All variants of av1_apply_temporal_filter() contain floating point
        // operations. Hence, clear the system state.

        // TODO(any): avx2/sse2 version should be changed to align with C
        // function before using. In particular, current avx2/sse2 function
        // only supports 32x32 block size and 5x5 filtering window.
        if (is_frame_high_bitdepth(frame_to_filter)) {  // for high bit-depth
#if CONFIG_AV1_HIGHBITDEPTH
          if (TF_BLOCK_SIZE == BLOCK_32X32 && TF_WINDOW_LENGTH == 5) {
            av1_highbd_apply_temporal_filter(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
          } else {
#endif  // CONFIG_AV1_HIGHBITDEPTH
            av1_apply_temporal_filter_c(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
#if CONFIG_AV1_HIGHBITDEPTH
          }
#endif  // CONFIG_AV1_HIGHBITDEPTH
        } else {
          // for 8-bit
          if (TF_BLOCK_SIZE == BLOCK_32X32 && TF_WINDOW_LENGTH == 5) {
            av1_apply_temporal_filter(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
          } else {
            av1_apply_temporal_filter_c(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
          }
        }
      }
    }
    tf_normalize_filtered_frame(mbd, block_size, mb_row, mb_col, num_planes,
                                accum, count, tf_ctx->output_frame);

    if (compute_frame_diff) {
      const int y_height = mb_height >> mbd->plane[0].subsampling_y;
      const int y_width = mb_width >> mbd->plane[0].subsampling_x;
      const int source_y_stride = frame_to_filter->y_stride;
      const int filter_y_stride = tf_ctx->output_frame->y_stride;
      const int source_offset =
          mb_row * y_height * source_y_stride + mb_col * y_width;
      const int filter_offset =
          mb_row * y_height * filter_y_stride + mb_col * y_width;
      unsigned int sse = 0;
      cpi->ppi->fn_ptr[block_size].vf(
          frame_to_filter->y_buffer + source_offset, source_y_stride,
          tf_ctx->output_frame->y_buffer + filter_offset, filter_y_stride,
          &sse);
      diff->sum += sse;
      diff->sse += sse * (int64_t)sse;
    }
  }
}